

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

shared_ptr<dap::ReaderWriter> __thiscall
dap::ReaderWriter::create(ReaderWriter *this,shared_ptr<dap::Reader> *r,shared_ptr<dap::Writer> *w)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<dap::ReaderWriter> sVar1;
  shared_ptr<(anonymous_namespace)::RW> local_30;
  shared_ptr<dap::Writer> *local_20;
  shared_ptr<dap::Writer> *w_local;
  shared_ptr<dap::Reader> *r_local;
  
  local_20 = w;
  w_local = (shared_ptr<dap::Writer> *)r;
  r_local = (shared_ptr<dap::Reader> *)this;
  std::
  make_shared<(anonymous_namespace)::RW,std::shared_ptr<dap::Reader>const&,std::shared_ptr<dap::Writer>const&>
            ((shared_ptr<dap::Reader> *)&local_30,(shared_ptr<dap::Writer> *)r);
  std::shared_ptr<dap::ReaderWriter>::shared_ptr<(anonymous_namespace)::RW,void>
            ((shared_ptr<dap::ReaderWriter> *)this,&local_30);
  std::shared_ptr<(anonymous_namespace)::RW>::~shared_ptr(&local_30);
  sVar1.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<dap::ReaderWriter>)
         sVar1.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ReaderWriter> ReaderWriter::create(
    const std::shared_ptr<Reader>& r,
    const std::shared_ptr<Writer>& w) {
  return std::make_shared<RW>(r, w);
}